

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall cmCTest::AddIfExists(cmCTest *this,Part part,char *file)

{
  bool bVar1;
  string name;
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,file,&local_49);
  bVar1 = CTestFileExists(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    AddSubmitFile(this,part,file);
  }
  else {
    std::__cxx11::string::string((string *)&local_48,file,&local_49);
    std::__cxx11::string::append((char *)&local_48);
    bVar1 = CTestFileExists(this,&local_48);
    if (bVar1) {
      AddSubmitFile(this,part,file);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool cmCTest::AddIfExists(Part part, const char* file)
{
  if ( this->CTestFileExists(file) )
    {
    this->AddSubmitFile(part, file);
    }
  else
    {
    std::string name = file;
    name += ".gz";
    if ( this->CTestFileExists(name) )
      {
      this->AddSubmitFile(part, file);
      }
    else
      {
      return false;
      }
    }
  return true;
}